

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
multi_line_documentation_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  _func_function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_MetaConfiguration_ptr_basic_ifstream<char,_std::char_traits<char>_>_ptr_int_ptr
  *local_90;
  _func_function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_MetaConfiguration_ptr_basic_ifstream<char,_std::char_traits<char>_>_ptr_int_ptr
  *local_88;
  string local_48 [7];
  char c;
  string comment;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  comment.field_2._8_8_ = error;
  std::__cxx11::string::string(local_48);
  while (iVar3 = std::istream::peek(), iVar3 != -1) {
    cVar1 = std::istream::get();
    if ((cVar1 == '*') && (iVar3 = std::istream::peek(), iVar3 == 0x2f)) goto LAB_00108869;
    std::__cxx11::string::operator+=(local_48,cVar1);
  }
  std::__cxx11::string::operator=((string *)(anonymous_namespace)::last_comment_abi_cxx11_,local_48)
  ;
LAB_00108869:
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)(anonymous_namespace)::current_property);
  if (bVar2) {
    local_88 = property_state;
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)(anonymous_namespace)::current_class);
    if (bVar2) {
      local_90 = class_state;
    }
    else {
      local_90 = initial_state;
    }
    local_88 = local_90;
  }
  std::
  function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
  ::
  function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
            ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
              *)__return_storage_ptr__,local_88);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

callback_t multi_line_documentation_state(MetaConfiguration &conf,
                                          std::ifstream &f, int &error) {
  std::string comment;
  char c;
  while (f.peek() != EOF) {
    c = f.get();
    if (c == '*' && f.peek() == '/') {
      goto exit;
    }
    comment += c;
  }
  last_comment = comment;

exit:
  return current_property ? property_state
                          : current_class ? class_state : initial_state;
}